

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tick.cpp
# Opt level: O0

void P_Ticker(void)

{
  bool bVar1;
  int local_c;
  int i;
  
  FInterpolator::UpdateInterpolations(&interpolator);
  r_NoInterpolate = true;
  if ((paused == 0) && (bVar1 = P_CheckTickerPaused(), !bVar1)) {
    DPSprite::NewTick();
    if (((level.time & 3U) == 0) && (((byte)bglobal._16_1_ >> 1 & 1) != 0)) {
      bglobal._16_1_ = bglobal._16_1_ & 0xfc | bglobal._16_1_ & 1 ^ 1;
    }
    local_c = 0;
    while ((local_c < 8 &&
           (((playeringame[local_c] & 1U) == 0 ||
            (*(int *)(&DAT_00d6354c + (long)local_c * 0x2a0) == 0))))) {
      local_c = local_c + 1;
    }
    if (local_c == 8) {
      S_ResumeSound(false);
    }
    P_ResetSightCounters(false);
    R_ClearInterpolationPath();
    r_NoInterpolate = false;
    P_ThinkParticles();
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      if (((playeringame[local_c] & 1U) != 0) &&
         (((bglobal._16_1_ & 1) == 0 ||
          (bVar1 = TObjPtr<DBot>::operator!=
                             ((TObjPtr<DBot> *)(&DAT_00d635f8 + (long)local_c * 0x2a0),(DBot *)0x0),
          !bVar1)))) {
        P_PlayerThink((player_t *)(&players + (long)local_c * 0x54));
      }
    }
    (*(StatusBar->super_DObject)._vptr_DObject[7])();
    FLevelLocals::Tick(&level);
    DThinker::RunThinkers();
    if (((bglobal._16_1_ & 1) == 0) && ((level.flags2 & 0x20) == 0)) {
      P_UpdateSpecials();
      P_RunEffects();
    }
    level.time = level.time + 1;
    level.maptime = level.maptime + 1;
    level.totaltime = level.totaltime + 1;
  }
  return;
}

Assistant:

void P_Ticker (void)
{
	int i;

	interpolator.UpdateInterpolations ();
	r_NoInterpolate = true;

	if (!demoplayback)
	{
		// This is a separate slot from the wipe in D_Display(), because this
		// is delayed slightly due to latency. (Even on a singleplayer game!)
//		GSnd->SetSfxPaused(!!playerswiping, 2);
	}

	// run the tic
	if (paused || P_CheckTickerPaused())
		return;

	DPSprite::NewTick();

	// [RH] Frozen mode is only changed every 4 tics, to make it work with A_Tracer().
	if ((level.time & 3) == 0)
	{
		if (bglobal.changefreeze)
		{
			bglobal.freeze ^= 1;
			bglobal.changefreeze = 0;
		}
	}

	// [BC] Do a quick check to see if anyone has the freeze time power. If they do,
	// then don't resume the sound, since one of the effects of that power is to shut
	// off the music.
	for (i = 0; i < MAXPLAYERS; i++ )
	{
		if (playeringame[i] && players[i].timefreezer != 0)
			break;
	}

	if ( i == MAXPLAYERS )
		S_ResumeSound (false);

	P_ResetSightCounters (false);
	R_ClearInterpolationPath();

	// Since things will be moving, it's okay to interpolate them in the renderer.
	r_NoInterpolate = false;

	P_ThinkParticles();	// [RH] make the particles think

	for (i = 0; i<MAXPLAYERS; i++)
		if (playeringame[i] &&
			/*Added by MC: Freeze mode.*/!(bglobal.freeze && players[i].Bot != NULL))
			P_PlayerThink (&players[i]);

	StatusBar->Tick ();		// [RH] moved this here
	level.Tick ();			// [RH] let the level tick
	DThinker::RunThinkers ();

	//if added by MC: Freeze mode.
	if (!bglobal.freeze && !(level.flags2 & LEVEL2_FROZEN))
	{
		P_UpdateSpecials ();
		P_RunEffects ();	// [RH] Run particle effects
	}

	// for par times
	level.time++;
	level.maptime++;
	level.totaltime++;
}